

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

char * NULLCString::strcpy(char *__dest,char *__src)

{
  long lVar1;
  uint in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint local_48;
  uint i;
  NULLCArray src_local;
  NULLCArray dst_local;
  
  lVar1 = CONCAT71(in_register_00000011,in_DL);
  if (__dest == (char *)0x0) {
    nullcThrowError("destination string is null");
    dst_local.ptr._4_4_ = 0xffffffff;
  }
  else if (lVar1 == 0) {
    nullcThrowError("source string is null");
    dst_local.ptr._4_4_ = 0xffffffff;
  }
  else {
    for (local_48 = 0; local_48 < in_ECX; local_48 = local_48 + 1) {
      if ((uint)__src <= local_48) {
        nullcThrowError("buffer overflow");
        dst_local.ptr._4_4_ = 0xffffffff;
        goto LAB_001465c8;
      }
      if (*(char *)(lVar1 + (ulong)local_48) == '\0') {
        __dest[local_48] = '\0';
        dst_local.ptr._4_4_ = local_48;
        goto LAB_001465c8;
      }
      __dest[local_48] = *(char *)(lVar1 + (ulong)local_48);
    }
    nullcThrowError("string is not null-terminated");
    dst_local.ptr._4_4_ = 0xffffffff;
  }
LAB_001465c8:
  return (char *)(ulong)dst_local.ptr._4_4_;
}

Assistant:

int strcpy(NULLCArray dst, NULLCArray src)
	{
		if(!dst.ptr)
		{
			nullcThrowError("destination string is null");
			return -1;
		}

		if(!src.ptr)
		{
			nullcThrowError("source string is null");
			return -1;
		}

		for(unsigned i = 0; i < src.len; i++)
		{
			if(i >= dst.len)
			{
				nullcThrowError("buffer overflow");
				return -1;
			}

			if(!src.ptr[i])
			{
				dst.ptr[i] = 0;

				return i;
			}
			else
			{
				dst.ptr[i] = src.ptr[i];
			}
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}